

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::~IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  _func_int *p_Var1;
  long *plVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcProfileDef).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcProfileDef).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  plVar2 = (long *)((this->Label).ptr.field_2._M_local_buf + (long)p_Var3);
  plVar2[-0x11] = 0x89e960;
  plVar2[3] = 0x89e9b0;
  plVar2[-6] = 0x89e988;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *(undefined8 *)p_Var1 = 0x89e9d8;
  *(undefined8 *)(p_Var1 + 0xa0) = 0x89ea00;
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30),*(long *)(p_Var1 + 0x40) + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
  }
  operator_delete(p_Var1,0xb8);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}